

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resldexe.cpp
# Opt level: O1

void __thiscall
CVmImageLoaderMres_resload::add_resource
          (CVmImageLoaderMres_resload *this,uint32_t seek_ofs,uint32_t siz,char *res_name,
          size_t res_name_len)

{
  int iVar1;
  
  if (((this->found_ == 0) && (this->respath_len_ == res_name_len)) &&
     (iVar1 = memicmp(this->respath_,res_name,res_name_len), iVar1 == 0)) {
    this->found_ = 1;
    this->res_seek_ = seek_ofs;
    this->res_size_ = siz;
  }
  return;
}

Assistant:

void add_resource(uint32_t seek_ofs, uint32_t siz,
                      const char *res_name, size_t res_name_len)
    {
        /* 
         *   if we've already found a match, there's no need to consider
         *   anything else 
         */
        if (found_)
            return;

        /* check to see if this is the one we're looking for */
        if (res_name_len == respath_len_
            && memicmp(respath_, res_name, res_name_len) == 0)
        {
            /* we found it */
            found_ = TRUE;

            /* remember the seek location */
            res_seek_ = seek_ofs;
            res_size_ = siz;
        }
    }